

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  long *plVar5;
  cmValue cVar6;
  string *psVar7;
  ulong *puVar8;
  size_type *psVar9;
  long *plVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string stdLibString;
  string fwSearchFlag;
  string libPathTerminator;
  string libPathFlag;
  string linkLanguage;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  string local_118;
  string local_f8;
  string local_d8;
  undefined8 local_b8;
  char *local_b0;
  string local_a8;
  string local_88;
  long *local_68;
  size_type local_60;
  long local_58 [2];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  string *local_38;
  
  local_68 = local_58;
  pcVar3 = (pcli->LinkLanguage)._M_dataplus._M_p;
  local_38 = frameworkPath;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (pcli->LinkLanguage)._M_string_length);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  pcVar4 = this->Makefile;
  local_138 = &local_128;
  pcVar3 = (pcli->LinkLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar3,pcVar3 + (pcli->LinkLanguage)._M_string_length);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x7cc7b3);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_f8.field_2._M_allocated_capacity = *puVar8;
    local_f8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *puVar8;
    local_f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_40 = linkPath;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  paVar1 = &local_d8.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar6 = cmMakefile::GetDefinition(pcVar4,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  local_48 = linkLibraries;
  if (cVar6.Value == (string *)0x0) {
    pcVar4 = this->Makefile;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"CMAKE_LIBRARY_PATH_FLAG","");
    cmMakefile::GetRequiredDefinition(pcVar4,&local_d8);
    std::__cxx11::string::_M_assign((string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_88);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity =
       local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar4 = this->Makefile;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar3 = (pcli->LinkLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,pcVar3 + (pcli->LinkLanguage)._M_string_length);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x7cc7b3);
  local_138 = &local_128;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_128 = *plVar10;
    lStack_120 = plVar5[3];
  }
  else {
    local_128 = *plVar10;
    local_138 = (long *)*plVar5;
  }
  local_130 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar6 = cmMakefile::GetDefinition(pcVar4,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (cVar6.Value == (string *)0x0) {
    pcVar4 = this->Makefile;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"CMAKE_LIBRARY_PATH_TERMINATOR","");
    cmMakefile::GetRequiredDefinition(pcVar4,&local_d8);
    std::__cxx11::string::_M_assign((string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_f8);
  }
  pcVar4 = this->Makefile;
  paVar2 = &local_a8.field_2;
  pcVar3 = (pcli->LinkLanguage)._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + (pcli->LinkLanguage)._M_string_length);
  local_d8._M_dataplus._M_p = (pointer)0x6;
  local_d8._M_string_length = 0x7cc7b3;
  local_d8.field_2._M_allocated_capacity = local_a8._M_string_length;
  local_d8.field_2._8_8_ = local_a8._M_dataplus._M_p;
  local_b8 = 0x13;
  local_b0 = "_STANDARD_LIBRARIES";
  views._M_len = 3;
  views._M_array = (iterator)&local_d8;
  cmCatViews_abi_cxx11_(&local_118,views);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
  local_138 = &local_128;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = this->Makefile;
  local_d8._M_dataplus._M_p = (pointer)0x6;
  local_d8._M_string_length = 0x7cc7b3;
  local_d8.field_2._M_allocated_capacity = local_60;
  local_d8.field_2._8_8_ = local_68;
  local_b8 = 0x16;
  local_b0 = "_FRAMEWORK_SEARCH_FLAG";
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_d8;
  cmCatViews_abi_cxx11_(&local_a8,views_00);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar4,&local_a8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  cmLinkLineComputer::ComputeFrameworkPath(&local_d8,linkLineComputer,pcli,&local_118);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmLinkLineComputer::ComputeLinkPath(linkLineComputer,pcli,&local_88,&local_f8,local_40);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(linkLineComputer,pcli,&local_138,local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::vector<BT<std::string>>& linkLibraries, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_FLAG")) {
    libPathFlag = *value;
  } else {
    libPathFlag =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  }

  std::string libPathTerminator;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_TERMINATOR")) {
    libPathTerminator = *value;
  } else {
    libPathTerminator =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");
  }

  // Add standard libraries for this language.
  std::string stdLibString = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", cli.GetLinkLanguage(), "_STANDARD_LIBRARIES"));

  // Append the framework search path flags.
  std::string fwSearchFlag = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_FRAMEWORK_SEARCH_FLAG"));

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator,
                                    linkPath);
  linkLineComputer->ComputeLinkLibraries(cli, stdLibString, linkLibraries);
}